

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-misc.c
# Opt level: O0

size_t lws_get_random(lws_context *context,void *buf,size_t len)

{
  size_t sVar1;
  size_t len_local;
  void *buf_local;
  lws_context *context_local;
  
  sVar1 = read(context->fd_random,buf,len);
  return sVar1;
}

Assistant:

size_t
lws_get_random(struct lws_context *context, void *buf, size_t len)
{
#if defined(__COVERITY__)
	memset(buf, 0, len);
	return len;
#else
	/* coverity[tainted_scalar] */
	return (size_t)read(context->fd_random, (char *)buf, len);
#endif
}